

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.c
# Opt level: O1

void apply_colormap(ColorMap *map)

{
  int iVar1;
  short sVar2;
  short sVar3;
  int iVar4;
  long lVar5;
  short sVar6;
  ColorMap *pCVar7;
  ulong uVar8;
  
  lVar5 = 0;
  do {
    sVar2 = -1;
    iVar4 = (int)lVar5;
    if (iVar4 != 0) {
      if (iVar4 == 1) {
        iVar1 = 0x70;
        if (_COLORS < 0x10) {
          iVar1 = 0x38;
        }
        if (_COLOR_PAIRS <= iVar1) {
          return;
        }
        if (lVar5 == 0) goto LAB_00108f7a;
      }
      sVar2 = color_map.bgColors[lVar5];
    }
LAB_00108f7a:
    pCVar7 = &color_map;
    uVar8 = 0;
    do {
      sVar6 = pCVar7->fgColors[0];
      sVar3 = 4;
      if (settings.darkgray != '\0') {
        sVar3 = sVar6;
      }
      if (sVar6 != 0) {
        sVar3 = sVar6;
      }
      sVar6 = sVar3;
      if (sVar3 != -1) {
        sVar6 = 0;
      }
      if (sVar3 != sVar2) {
        sVar6 = sVar3;
      }
      init_pair((int)(short)((short)(iVar4 << (4U - (_COLORS < 0x10) & 0x1f)) + (short)uVar8 + 1),
                (int)sVar6,(int)sVar2);
      uVar8 = uVar8 + 1;
      pCVar7 = (ColorMap *)(pCVar7->fgColors + 1);
    } while (uVar8 < (ulong)(0xf < _COLORS) * 8 + 8);
    lVar5 = lVar5 + 1;
    if (lVar5 == 7) {
      return;
    }
  } while( true );
}

Assistant:

static void apply_colormap(struct ColorMap *map)
{
    int bg, fg;
    short bgColor, fgColor;

    /* Set up all color pairs.
     * If using bold, then set up color pairs for foreground colors
     *   0-7; if not, then set up color pairs for foreground colors
     *   0-15.
     * If there are sufficient color pairs, then set them up for 6
     * possible non-default background colors (don't use white, there
     * are terminals that hate it).  So there are 112 pairs required
     * for 16 colors, or 56 required for 8 colors. */
    for (bg = 0; bg < BG_COLOR_COUNT; bg++) {
	/* Do not set up background colors if there are not enough
	 * color pairs. */
	if (bg == 1 && !BG_COLOR_SUPPORT)
	    break;

	/* For no background, use the default background color;
	 * otherwise use the color from the color map. */
	bgColor = bg ? map->bgColors[bg] : -1;

	for (fg = 0; fg < FG_COLOR_COUNT; fg++) {
	    fgColor = map->fgColors[fg];

	    /* Replace black with blue if darkgray is not set. */
	    if (fgColor == COLOR_BLACK && !settings.darkgray)
		fgColor = COLOR_BLUE;
	    if (fgColor == bgColor && fgColor != -1)
		fgColor = COLOR_BLACK;

	    init_pair(bg * FG_COLOR_COUNT + fg + 1, fgColor, bgColor);
	}
    }

    return;
}